

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_4468fb::LastChar::~LastChar(LastChar *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x38);
  return;
}

Assistant:

~LastChar() final = default;